

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

Vec4 __thiscall
deqp::gles3::Functional::TriangleDerivateCase::getSurfaceThreshold(TriangleDerivateCase *this)

{
  int i;
  long lVar1;
  RenderTarget *pRVar2;
  Vector<float,_4> *res_1;
  long in_RSI;
  uint uVar3;
  float fVar4;
  ulong in_XMM1_Qa;
  Vec4 VVar5;
  Vector<float,_4> res_4;
  IVec4 intThreshold;
  Vector<float,_4> res;
  Vector<int,_4> res_2;
  float local_48 [4];
  int local_38 [4];
  undefined8 local_28;
  undefined8 uStack_20;
  byte local_18 [16];
  
  if (*(int *)(in_RSI + 0xe8) == 0) {
    pRVar2 = Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
    local_28._0_4_ = (pRVar2->m_pixelFormat).redBits;
    local_28._4_4_ = (pRVar2->m_pixelFormat).greenBits;
    uStack_20._0_4_ = (pRVar2->m_pixelFormat).blueBits;
    uStack_20._4_4_ = (pRVar2->m_pixelFormat).alphaBits;
    lVar1 = 0;
    do {
      local_48[lVar1] = 1.4013e-45;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    local_18[0] = 0;
    local_18[1] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    lVar1 = 0;
    do {
      *(int *)(local_18 + lVar1 * 4) = 8 - *(int *)((long)&local_28 + lVar1 * 4);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    local_38[0] = 0;
    local_38[1] = 0;
    local_38[2] = 0;
    local_38[3] = 0;
    lVar1 = 0;
    do {
      local_38[lVar1] = (int)local_48[lVar1] << (local_18[lVar1 * 4] & 0x1f);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    lVar1 = 0;
    do {
      local_48[lVar1] = (float)local_38[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    lVar1 = 0;
    uVar3 = 0x437f0000;
    do {
      in_XMM1_Qa = (ulong)(uint)(local_48[lVar1] / 255.0);
      *(float *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                lVar1 * 4) = local_48[lVar1] / 255.0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  else if (*(int *)(in_RSI + 0xe8) == 1) {
    lVar1 = 0;
    do {
      local_38[lVar1] = 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    local_28 = 0;
    uStack_20 = 0;
    lVar1 = 0;
    do {
      *(float *)((long)&local_28 + lVar1 * 4) = (float)local_38[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    lVar1 = 0;
    uVar3 = 0x437f0000;
    do {
      fVar4 = *(float *)((long)&local_28 + lVar1 * 4) / 255.0;
      in_XMM1_Qa = (ulong)(uint)fVar4;
      *(float *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                lVar1 * 4) = fVar4;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  else {
    uVar3 = 0;
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  }
  VVar5.m_data[1] = 0.0;
  VVar5.m_data[0] = (float)uVar3;
  VVar5.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar5.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

tcu::Vec4 TriangleDerivateCase::getSurfaceThreshold (void) const
{
	switch (m_surfaceType)
	{
		case SURFACETYPE_DEFAULT_FRAMEBUFFER:
		{
			const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
			const tcu::IVec4		channelBits		(pixelFormat.redBits, pixelFormat.greenBits, pixelFormat.blueBits, pixelFormat.alphaBits);
			const tcu::IVec4		intThreshold	= tcu::IVec4(1) << (8 - channelBits);
			const tcu::Vec4			normThreshold	= intThreshold.asFloat() / 255.0f;

			return normThreshold;
		}

		case SURFACETYPE_UNORM_FBO:				return tcu::IVec4(1).asFloat() / 255.0f;
		case SURFACETYPE_FLOAT_FBO:				return tcu::Vec4(0.0f);
		default:
			DE_ASSERT(false);
			return tcu::Vec4(0.0f);
	}
}